

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O2

void BrotliSplitBlock(MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
                     size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split,
                     BlockSplitFromDecoder *literals_block_splits_decoder,
                     size_t *current_block_literals,BlockSplitFromDecoder *cmds_block_splits_decoder
                     ,size_t *current_block_cmds)

{
  int *piVar1;
  char *pcVar2;
  long *plVar3;
  uint uVar4;
  ushort uVar5;
  size_t byte_ix;
  size_t sVar6;
  void *pvVar7;
  uint16_t *puVar8;
  uint8_t *puVar9;
  uint32_t *puVar10;
  void *pvVar11;
  ulong uVar12;
  ushort *puVar13;
  void *pvVar14;
  double *pdVar15;
  void *pvVar16;
  void *pvVar17;
  long lVar18;
  void *pvVar19;
  HistogramLiteral *out;
  HistogramLiteral *out_00;
  HistogramCommand *out_01;
  HistogramLiteral *pHVar20;
  ulong uVar21;
  HistogramCommand *pHVar22;
  BlockSplit *split;
  Command *pCVar23;
  long lVar24;
  byte bVar25;
  int iVar26;
  byte *pbVar27;
  size_t sVar28;
  uint *puVar29;
  uint *puVar30;
  ulong uVar31;
  size_t __n;
  long lVar32;
  byte bVar33;
  uint32_t uVar34;
  ulong uVar35;
  ulong uVar36;
  size_t sVar37;
  size_t total_length;
  size_t sVar38;
  size_t __n_00;
  long lVar39;
  double *pdVar40;
  ulong uVar41;
  long lVar42;
  uint16_t *puVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  bool bVar47;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar48;
  double dVar49;
  double dVar50;
  BrotliEncoderParams *in_stack_ffffffffffffefe8;
  HistogramLiteral *pHVar51;
  HistogramCommand *pHVar52;
  ulong local_1008;
  HistogramCommand *local_1000;
  void *local_ff0;
  ulong local_fe8;
  uint32_t *local_fe0;
  ulong local_fd0;
  double local_fc8;
  size_t local_fc0;
  ulong local_fb8;
  uint32_t *local_fb0;
  uint32_t *local_fa8;
  void *local_fa0;
  long local_f98;
  void *local_f90;
  uint32_t *local_f88;
  HistogramPair *local_f80;
  ulong local_f78;
  ulong local_f70;
  HistogramPair *local_f58;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [2816];
  ulong local_40;
  double local_38;
  
  sVar38 = 0;
  sVar6 = num_commands;
  pCVar23 = cmds;
  while (bVar47 = sVar6 != 0, sVar6 = sVar6 - 1, bVar47) {
    sVar38 = sVar38 + pCVar23->insert_len_;
    pCVar23 = pCVar23 + 1;
  }
  sVar6 = pos;
  if (sVar38 == 0) {
    local_ff0 = (void *)0x0;
  }
  else {
    local_ff0 = BrotliAllocate(m,sVar38);
  }
  puVar10 = &cmds->copy_len_;
  lVar42 = 0;
  sVar28 = num_commands;
  sVar37 = pos;
  split = (BlockSplit *)mask;
  while (bVar47 = sVar28 != 0, sVar28 = sVar28 - 1, bVar47) {
    uVar36 = sVar37 & (ulong)split;
    __n_00 = (size_t)((Command *)(puVar10 + -1))->insert_len_;
    if (split < (BlockSplit *)(uVar36 + __n_00)) {
      __n = mask + (1 - uVar36);
      memcpy((void *)((long)local_ff0 + lVar42),data + uVar36,__n);
      lVar42 = lVar42 + __n;
      __n_00 = __n_00 - __n;
      uVar36 = 0;
    }
    if (__n_00 != 0) {
      memcpy((void *)((long)local_ff0 + lVar42),data + uVar36,__n_00);
      lVar42 = lVar42 + __n_00;
    }
    sVar37 = (ulong)(*puVar10 & 0x1ffffff) + __n_00 + uVar36;
    puVar10 = puVar10 + 4;
  }
  local_f80 = (HistogramPair *)0x3;
  if (literals_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    local_fe8 = 100;
    if (sVar38 < 0xd480) {
      local_fe8 = (ulong)(ushort)((ushort)sVar38 / 0x220 + 1);
    }
    if (sVar38 == 0) {
      literal_split->num_types = 1;
    }
    else {
      if (0x7f < sVar38) {
        pvVar11 = BrotliAllocate(m,local_fe8 * 0x410);
        pvVar7 = pvVar11;
        for (lVar42 = 0; local_fe8 * 0x410 - lVar42 != 0; lVar42 = lVar42 + 0x410) {
          memset((void *)((long)pvVar11 + lVar42),0,0x408);
          *(undefined8 *)((long)pvVar11 + lVar42 + 0x408) = 0x7ff0000000000000;
        }
        uVar36 = 7;
        for (uVar35 = 0; uVar35 != local_fe8; uVar35 = uVar35 + 1) {
          uVar12 = (uVar35 * sVar38) / local_fe8;
          if (uVar35 != 0) {
            uVar36 = (ulong)(uint)((int)uVar36 * 0x41a7);
            uVar12 = uVar12 + uVar36 % (sVar38 / local_fe8);
          }
          if (sVar38 <= uVar12 + 0x46) {
            uVar12 = sVar38 - 0x47;
          }
          plVar3 = (long *)((long)pvVar7 + uVar35 * 0x410 + 0x400);
          *plVar3 = *plVar3 + 0x46;
          for (lVar42 = -0x46; lVar42 != 0; lVar42 = lVar42 + 1) {
            piVar1 = (int *)((long)pvVar7 +
                            (ulong)*(byte *)((long)local_ff0 + lVar42 + uVar12 + 0x46) * 4 +
                            uVar35 * 0x410);
            *piVar1 = *piVar1 + 1;
          }
        }
        uVar35 = (sVar38 * 2) / 0x46 + local_fe8 + 99;
        uVar36 = 7;
        for (uVar12 = 0; uVar12 < uVar35 - uVar35 % local_fe8; uVar12 = uVar12 + 1) {
          memset(local_b40,0,0x408);
          uVar36 = (ulong)(uint)((int)uVar36 * 0x41a7);
          pbVar27 = (byte *)(uVar36 % (sVar38 - 0x45) + (long)local_ff0);
          for (lVar42 = -0x46; lVar42 != 0; lVar42 = lVar42 + 1) {
            bVar25 = *pbVar27;
            pbVar27 = pbVar27 + 1;
            *(int *)(local_b40 + (ulong)bVar25 * 4) = *(int *)(local_b40 + (ulong)bVar25 * 4) + 1;
          }
          lVar42 = (uVar12 % local_fe8) * 0x410;
          plVar3 = (long *)((long)pvVar7 + lVar42 + 0x400);
          *plVar3 = *plVar3 + 0x46;
          for (lVar24 = 0; lVar24 != 0x100; lVar24 = lVar24 + 1) {
            piVar1 = (int *)((long)pvVar7 + lVar24 * 4 + lVar42);
            *piVar1 = *piVar1 + *(int *)(local_b40 + lVar24 * 4);
          }
        }
        pvVar11 = BrotliAllocate(m,sVar38);
        iVar26 = (int)local_fe8;
        pdVar15 = (double *)BrotliAllocate(m,(ulong)(uint)(iVar26 << 0xb));
        pvVar14 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 8));
        sVar6 = (iVar26 + 7U >> 3) * sVar38;
        if (sVar6 == 0) {
          local_fa0 = (void *)0x0;
        }
        else {
          local_fa0 = BrotliAllocate(m,sVar6);
        }
        pvVar16 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 2));
        lVar42 = 3;
        if (10 < params->quality) {
          lVar42 = 10;
        }
        puVar30 = (uint *)((long)pvVar7 + 0x400);
        lVar24 = (long)pvVar7 + 0x3fc;
        uVar36 = 0;
        for (lVar18 = 0; lVar18 != lVar42; lVar18 = lVar18 + 1) {
          if (local_fe8 < 2) {
            for (sVar6 = 0; sVar38 != sVar6; sVar6 = sVar6 + 1) {
              *(undefined1 *)((long)pvVar11 + sVar6) = 0;
            }
            uVar36 = 1;
          }
          else {
            uVar35 = local_fe8 + 7 >> 3;
            memset(pdVar15,0,local_fe8 << 0xb);
            puVar29 = puVar30;
            for (uVar36 = 0; local_fe8 != uVar36; uVar36 = uVar36 + 1) {
              uVar12 = (ulong)*puVar29;
              if (uVar12 < 0x100) {
                dVar48 = kLog2Table[uVar12];
              }
              else {
                dVar48 = log2((double)uVar12);
              }
              pdVar15[uVar36] = dVar48;
              puVar29 = puVar29 + 0x104;
            }
            lVar39 = local_fe8 * 0x7f8;
            lVar45 = 0x100;
            lVar32 = lVar24;
            while (bVar47 = lVar45 != 0, lVar45 = lVar45 + -1, bVar47) {
              pdVar40 = pdVar15;
              for (lVar44 = 0; local_fe8 * 0x82 - lVar44 != 0; lVar44 = lVar44 + 0x82) {
                dVar48 = *pdVar40;
                uVar4 = *(uint *)(lVar32 + lVar44 * 8);
                uVar36 = (ulong)uVar4;
                dVar49 = -2.0;
                if (uVar36 != 0) {
                  if (uVar4 < 0x100) {
                    dVar49 = kLog2Table[uVar36];
                  }
                  else {
                    dVar49 = log2((double)uVar36);
                  }
                }
                *(double *)((long)pdVar40 + lVar39) = dVar48 - dVar49;
                pdVar40 = pdVar40 + 1;
              }
              lVar39 = lVar39 + local_fe8 * -8;
              lVar32 = lVar32 + -4;
            }
            memset(pvVar14,0,local_fe8 * 8);
            memset(local_fa0,0,uVar35 * sVar38);
            for (uVar36 = 0; uVar36 != sVar38; uVar36 = uVar36 + 1) {
              bVar25 = *(byte *)((long)local_ff0 + uVar36);
              dVar48 = 1e+99;
              for (uVar12 = 0; local_fe8 != uVar12; uVar12 = uVar12 + 1) {
                dVar49 = pdVar15[bVar25 * local_fe8 + uVar12] +
                         *(double *)((long)pvVar14 + uVar12 * 8);
                *(double *)((long)pvVar14 + uVar12 * 8) = dVar49;
                if (dVar49 < dVar48) {
                  *(char *)((long)pvVar11 + uVar36) = (char)uVar12;
                  dVar48 = dVar49;
                }
              }
              dVar49 = 28.1;
              if (uVar36 < 2000) {
                dVar49 = (((double)(long)uVar36 * 0.07) / 2000.0 + 0.77) * 28.1;
              }
              for (uVar12 = 0; local_fe8 != uVar12; uVar12 = uVar12 + 1) {
                dVar50 = *(double *)((long)pvVar14 + uVar12 * 8) - dVar48;
                *(double *)((long)pvVar14 + uVar12 * 8) = dVar50;
                if (dVar49 <= dVar50) {
                  *(double *)((long)pvVar14 + uVar12 * 8) = dVar49;
                  pbVar27 = (byte *)((long)local_fa0 + (uVar12 >> 3) + uVar36 * uVar35);
                  *pbVar27 = *pbVar27 | '\x01' << ((byte)uVar12 & 7);
                }
              }
            }
            bVar25 = *(byte *)((long)pvVar11 + (sVar38 - 1));
            pvVar17 = (void *)((sVar38 - 2) * uVar35 + (long)local_fa0);
            uVar36 = 1;
            for (sVar6 = sVar38; sVar6 != 1; sVar6 = sVar6 - 1) {
              if ((*(byte *)((long)pvVar17 + (ulong)(bVar25 >> 3)) >> (bVar25 & 7) & 1) != 0) {
                bVar33 = *(byte *)((long)pvVar11 + (sVar6 - 2));
                uVar36 = uVar36 + (bVar25 != bVar33);
                bVar25 = bVar33;
              }
              *(byte *)((long)pvVar11 + (sVar6 - 2)) = bVar25;
              pvVar17 = (void *)((long)pvVar17 - uVar35);
            }
          }
          for (uVar35 = 0; local_fe8 != uVar35; uVar35 = uVar35 + 1) {
            *(undefined2 *)((long)pvVar16 + uVar35 * 2) = 0x100;
          }
          uVar5 = 0;
          for (sVar6 = 0; sVar38 != sVar6; sVar6 = sVar6 + 1) {
            if (*(short *)((long)pvVar16 + (ulong)*(byte *)((long)pvVar11 + sVar6) * 2) == 0x100) {
              *(ushort *)((long)pvVar16 + (ulong)*(byte *)((long)pvVar11 + sVar6) * 2) = uVar5;
              uVar5 = uVar5 + 1;
            }
          }
          for (sVar6 = 0; sVar38 != sVar6; sVar6 = sVar6 + 1) {
            *(undefined1 *)((long)pvVar11 + sVar6) =
                 *(undefined1 *)((long)pvVar16 + (ulong)*(byte *)((long)pvVar11 + sVar6) * 2);
          }
          local_fe8 = (ulong)uVar5;
          for (lVar32 = 0; local_fe8 * 0x410 - lVar32 != 0; lVar32 = lVar32 + 0x410) {
            pvVar17 = pvVar7;
            memset((void *)((long)pvVar7 + lVar32),0,0x408);
            *(undefined8 *)((long)pvVar7 + lVar32 + 0x408) = 0x7ff0000000000000;
            pvVar7 = pvVar17;
          }
          for (sVar6 = 0; sVar38 != sVar6; sVar6 = sVar6 + 1) {
            lVar32 = (ulong)*(byte *)((long)pvVar11 + sVar6) * 0x410;
            piVar1 = (int *)((long)pvVar7 + (ulong)*(byte *)((long)local_ff0 + sVar6) * 4 + lVar32);
            *piVar1 = *piVar1 + 1;
            plVar3 = (long *)((long)pvVar7 + lVar32 + 0x400);
            *plVar3 = *plVar3 + 1;
          }
        }
        BrotliFree(m,pdVar15);
        BrotliFree(m,pvVar14);
        BrotliFree(m,local_fa0);
        BrotliFree(m,pvVar16);
        BrotliFree(m,pvVar7);
        if (uVar36 == 0) {
          local_fe0 = (uint32_t *)0x0;
          pvVar7 = (void *)0x0;
        }
        else {
          local_fe0 = (uint32_t *)BrotliAllocate(m,uVar36 * 4);
          pvVar7 = BrotliAllocate(m,uVar36 * 4);
        }
        uVar35 = uVar36 * 0x10 + 0x3f0;
        local_f70 = uVar35 >> 6;
        if (uVar35 < 0x40) {
          out = (HistogramLiteral *)0x0;
          local_fb0 = (uint32_t *)0x0;
        }
        else {
          out = (HistogramLiteral *)BrotliAllocate(m,local_f70 * 0x410);
          local_fb0 = (uint32_t *)BrotliAllocate(m,local_f70 * 4);
        }
        if (uVar36 == 0) {
          out_00 = (HistogramLiteral *)0x0;
        }
        else {
          uVar35 = 0x40;
          if (uVar36 < 0x40) {
            uVar35 = uVar36;
          }
          out_00 = (HistogramLiteral *)BrotliAllocate(m,uVar35 * 0x410);
        }
        local_f58 = (HistogramPair *)BrotliAllocate(m,0xc018);
        memset(sizes,0,0x100);
        memset(new_clusters,0,0x100);
        memset(symbols,0,0x100);
        memset(remap,0,0x100);
        memset(pvVar7,0,uVar36 * 4);
        lVar42 = 0;
        sVar6 = 0;
        while (sVar28 = sVar6 + 1, sVar28 - sVar38 != 1) {
          piVar1 = (int *)((long)pvVar7 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if ((sVar28 == sVar38) ||
             (pcVar2 = (char *)((long)pvVar11 + sVar6), sVar6 = sVar28,
             *pcVar2 != *(char *)((long)pvVar11 + sVar28))) {
            lVar42 = lVar42 + 1;
            sVar6 = sVar28;
          }
        }
        local_fc8 = 0.0;
        local_f88 = local_fe0;
        local_fb8 = 0;
        uVar12 = 0;
        local_f90 = (void *)0x0;
        local_fa0 = (void *)0x0;
        uVar35 = uVar36;
        local_fa8 = (uint32_t *)local_f70;
        while( true ) {
          uVar21 = 0x40;
          if (uVar35 < 0x40) {
            uVar21 = uVar35;
          }
          uVar46 = uVar36 - uVar12;
          if (uVar36 < uVar12 || uVar46 == 0) break;
          for (uVar41 = 0; uVar41 != uVar21; uVar41 = uVar41 + 1) {
            pHVar20 = out_00 + uVar41;
            pHVar51 = out_00;
            memset(pHVar20,0,0x408);
            out_00[uVar41].bit_cost_ = INFINITY;
            uVar31 = 0;
            while (uVar31 < *(uint *)((long)pvVar7 + (uVar12 + uVar41) * 4)) {
              pHVar20->data_[*(byte *)((long)local_ff0 + uVar31 + (long)local_fc8)] =
                   pHVar20->data_[*(byte *)((long)local_ff0 + uVar31 + (long)local_fc8)] + 1;
              uVar31 = uVar31 + 1;
              pHVar20->total_count_ = uVar31;
            }
            dVar48 = BrotliPopulationCostLiteral(pHVar20);
            pHVar20->bit_cost_ = dVar48;
            new_clusters[uVar41] = (uint32_t)uVar41;
            symbols[uVar41] = (uint32_t)uVar41;
            sizes[uVar41] = 1;
            local_fc8 = (double)((long)local_fc8 + uVar31);
            out_00 = pHVar51;
          }
          if (0x3f < uVar46) {
            uVar46 = 0x40;
          }
          sVar6 = BrotliHistogramCombineLiteral
                            (out_00,sizes,symbols,new_clusters,local_f58,uVar46,uVar46,0x40,0x800);
          uVar46 = (long)local_fa0 + sVar6;
          if (local_f70 < uVar46) {
            uVar41 = local_f70;
            if (local_f70 == 0) {
              uVar41 = uVar46;
            }
            do {
              uVar31 = uVar41;
              uVar41 = uVar31 * 2;
            } while (uVar31 < uVar46);
            pHVar20 = (HistogramLiteral *)BrotliAllocate(m,uVar31 * 0x410);
            if (local_f70 != 0) {
              memcpy(pHVar20,out,local_f70 * 0x410);
            }
            BrotliFree(m,out);
            out = pHVar20;
            local_f70 = uVar31;
          }
          uVar46 = (long)local_f90 + sVar6;
          if (local_fa8 < uVar46) {
            puVar10 = local_fa8;
            if (local_fa8 == (uint32_t *)0x0) {
              puVar10 = (uint32_t *)uVar46;
            }
            do {
              uVar41 = (ulong)puVar10;
              puVar10 = (uint32_t *)(uVar41 * 2);
            } while (uVar41 < uVar46);
            puVar10 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
            if (local_fa8 != (uint32_t *)0x0) {
              memcpy(puVar10,local_fb0,(long)local_fa8 << 2);
            }
            BrotliFree(m,local_fb0);
            local_fa8 = (uint32_t *)uVar41;
            local_fb0 = puVar10;
          }
          pHVar20 = out + (long)local_fa0;
          for (sVar38 = 0; sVar6 != sVar38; sVar38 = sVar38 + 1) {
            uVar4 = new_clusters[sVar38];
            memcpy(pHVar20,out_00 + uVar4,0x410);
            local_fb0[(long)local_f90 + sVar38] = sizes[uVar4];
            remap[new_clusters[sVar38]] = (uint32_t)sVar38;
            pHVar20 = pHVar20 + 1;
          }
          local_f90 = (void *)((long)local_f90 + sVar38);
          local_fa0 = (void *)((long)local_fa0 + sVar38);
          for (uVar46 = 0; uVar21 != uVar46; uVar46 = uVar46 + 1) {
            local_f88[uVar46] = remap[symbols[uVar46]] + (int)local_fb8;
          }
          local_fb8 = local_fb8 + sVar6;
          uVar12 = uVar12 + 0x40;
          uVar35 = uVar35 - 0x40;
          local_f88 = local_f88 + 0x40;
        }
        BrotliFree(m,out_00);
        uVar35 = (local_fb8 >> 1) * local_fb8;
        if (local_fb8 << 6 < uVar35) {
          uVar35 = local_fb8 << 6;
        }
        if (0x800 < uVar35) {
          BrotliFree(m,local_f58);
          local_f58 = (HistogramPair *)BrotliAllocate(m,uVar35 * 0x18 + 0x18);
        }
        if (local_fb8 == 0) {
          puVar10 = (uint32_t *)0x0;
        }
        else {
          puVar10 = (uint32_t *)BrotliAllocate(m,local_fb8 * 4);
        }
        for (uVar12 = 0; local_fb8 != uVar12; uVar12 = uVar12 + 1) {
          puVar10[uVar12] = (uint32_t)uVar12;
        }
        sVar6 = BrotliHistogramCombineLiteral
                          (out,local_fb0,local_fe0,puVar10,local_f58,local_fb8,uVar36,0x100,uVar35);
        BrotliFree(m,local_f58);
        BrotliFree(m,local_fb0);
        if (local_fb8 == 0) {
          pvVar14 = (void *)0x0;
        }
        else {
          pvVar14 = BrotliAllocate(m,local_fb8 * 4);
        }
        for (uVar35 = 0; local_fb8 != uVar35; uVar35 = uVar35 + 1) {
          *(undefined4 *)((long)pvVar14 + uVar35 * 4) = 0xffffffff;
        }
        split = (BlockSplit *)0x0;
        iVar26 = 0;
        for (uVar35 = 0; uVar35 != uVar36; uVar35 = uVar35 + 1) {
          memset(local_b40,0,0x408);
          local_b40._1032_8_ = INFINITY;
          uVar12 = 0;
          while (uVar12 < *(uint *)((long)pvVar7 + uVar35 * 4)) {
            *(int *)(local_b40 +
                    (ulong)*(byte *)((long)local_ff0 + uVar12 + (long)&split->num_types) * 4) =
                 *(int *)(local_b40 +
                         (ulong)*(byte *)((long)local_ff0 + uVar12 + (long)&split->num_types) * 4) +
                 1;
            uVar12 = uVar12 + 1;
            local_b40._1024_8_ = uVar12;
          }
          lVar42 = uVar35 - 1;
          if (uVar35 == 0) {
            lVar42 = 0;
          }
          uVar21 = (ulong)local_fe0[lVar42];
          local_fc8 = BrotliHistogramBitCostDistanceLiteral
                                ((HistogramLiteral *)local_b40,out + uVar21);
          split = (BlockSplit *)((long)&split->num_types + uVar12);
          for (sVar38 = 0; sVar6 != sVar38; sVar38 = sVar38 + 1) {
            dVar48 = BrotliHistogramBitCostDistanceLiteral
                               ((HistogramLiteral *)local_b40,out + puVar10[sVar38]);
            if (dVar48 < local_fc8) {
              uVar21 = (ulong)puVar10[sVar38];
              local_fc8 = dVar48;
            }
          }
          local_fe0[uVar35] = (uint32_t)uVar21;
          if (*(int *)((long)pvVar14 + uVar21 * 4) == -1) {
            *(int *)((long)pvVar14 + uVar21 * 4) = iVar26;
            iVar26 = iVar26 + 1;
          }
        }
        BrotliFree(m,puVar10);
        BrotliFree(m,out);
        uVar35 = literal_split->types_alloc_size;
        if (uVar35 < uVar36) {
          if (uVar35 == 0) {
            uVar35 = uVar36;
          }
          do {
            uVar12 = uVar35;
            uVar35 = uVar12 * 2;
          } while (uVar12 < uVar36);
          puVar9 = (uint8_t *)BrotliAllocate(m,uVar12);
          if (literal_split->types_alloc_size != 0) {
            memcpy(puVar9,literal_split->types,literal_split->types_alloc_size);
          }
          BrotliFree(m,literal_split->types);
          literal_split->types = puVar9;
          literal_split->types_alloc_size = uVar12;
        }
        uVar35 = literal_split->lengths_alloc_size;
        if (uVar35 < uVar36) {
          if (uVar35 == 0) {
            uVar35 = uVar36;
          }
          do {
            uVar12 = uVar35;
            uVar35 = uVar12 * 2;
          } while (uVar12 < uVar36);
          puVar10 = (uint32_t *)BrotliAllocate(m,uVar12 * 4);
          if (literal_split->lengths_alloc_size != 0) {
            memcpy(puVar10,literal_split->lengths,literal_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,literal_split->lengths);
          literal_split->lengths = puVar10;
          literal_split->lengths_alloc_size = uVar12;
        }
        uVar12 = 0;
        sVar38 = 0;
        uVar35 = 0;
        do {
          uVar34 = 0;
          uVar21 = uVar12;
          do {
            uVar12 = uVar21 + 1;
            sVar6 = uVar12 - uVar36;
            uVar46 = uVar35 & 0xff;
            if (sVar6 == 1) {
              literal_split->num_blocks = sVar38;
              literal_split->num_types = uVar46 + 1;
              BrotliFree(m,pvVar14);
              BrotliFree(m,pvVar7);
              BrotliFree(m,local_fe0);
              BrotliFree(m,pvVar11);
              goto LAB_00114f3c;
            }
            uVar34 = uVar34 + *(int *)((long)pvVar7 + uVar12 * 4 + -4);
            puVar30 = local_fe0 + uVar21;
          } while ((uVar12 != uVar36) && (uVar21 = uVar12, *puVar30 == local_fe0[uVar12]));
          uVar4 = *(uint *)((long)pvVar14 + (ulong)*puVar30 * 4);
          bVar25 = (byte)uVar4;
          literal_split->types[sVar38] = bVar25;
          literal_split->lengths[sVar38] = uVar34;
          bVar33 = (byte)uVar35;
          uVar35 = (ulong)uVar4;
          if (bVar25 < bVar33) {
            uVar35 = uVar46;
          }
          sVar38 = sVar38 + 1;
        } while( true );
      }
      sVar28 = literal_split->num_blocks;
      uVar35 = literal_split->types_alloc_size;
      uVar36 = sVar28 + 1;
      if (uVar35 < uVar36) {
        if (uVar35 == 0) {
          uVar35 = uVar36;
        }
        do {
          uVar12 = uVar35;
          uVar35 = uVar12 * 2;
        } while (uVar12 < uVar36);
        puVar9 = (uint8_t *)BrotliAllocate(m,uVar12);
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar9,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar9;
        literal_split->types_alloc_size = uVar12;
        sVar28 = literal_split->num_blocks;
        uVar36 = sVar28 + 1;
      }
      uVar35 = literal_split->lengths_alloc_size;
      if (uVar35 < uVar36) {
        if (uVar35 == 0) {
          uVar35 = uVar36;
        }
        do {
          uVar12 = uVar35;
          uVar35 = uVar12 * 2;
        } while (uVar12 < uVar36);
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar12 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar10,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar10;
        literal_split->lengths_alloc_size = uVar12;
        sVar28 = literal_split->num_blocks;
      }
      literal_split->num_types = 1;
      literal_split->types[sVar28] = '\0';
      sVar28 = literal_split->num_blocks;
      literal_split->lengths[sVar28] = (uint32_t)sVar38;
      literal_split->num_blocks = sVar28 + 1;
    }
  }
  else {
    BrotliSplitBlockLiteralsFromStored
              (m,cmds,num_commands,pos,sVar6,literal_split,literals_block_splits_decoder,
               current_block_literals);
  }
LAB_00114f3c:
  BrotliFree(m,local_ff0);
  if (num_commands == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = BrotliAllocate(m,num_commands * 2);
  }
  uVar36 = 7;
  puVar8 = &cmds->cmd_prefix_;
  for (sVar38 = 0; num_commands != sVar38; sVar38 = sVar38 + 1) {
    *(uint16_t *)((long)pvVar7 + sVar38 * 2) = *puVar8;
    puVar8 = puVar8 + 8;
  }
  if (cmds_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    local_fd0 = (ulong)(ushort)((ushort)num_commands / 0x212 + 1);
    if (0x6783 < num_commands) {
      local_fd0 = 0x32;
    }
    if (num_commands == 0) {
      insert_and_copy_split->num_types = 1;
    }
    else {
      if (0x7f < num_commands) {
        pvVar11 = BrotliAllocate(m,local_fd0 * 0xb10);
        for (lVar42 = 0; local_fd0 * 0xb10 - lVar42 != 0; lVar42 = lVar42 + 0xb10) {
          memset((void *)(lVar42 + (long)pvVar11),0,0xb08);
          *(undefined8 *)((long)pvVar11 + lVar42 + 0xb08) = 0x7ff0000000000000;
        }
        for (uVar35 = 0; uVar35 != local_fd0; uVar35 = uVar35 + 1) {
          uVar12 = (uVar35 * num_commands) / local_fd0;
          if (uVar35 != 0) {
            uVar36 = (ulong)(uint)((int)uVar36 * 0x41a7);
            uVar12 = uVar12 + uVar36 % (num_commands / local_fd0);
          }
          if (num_commands <= uVar12 + 0x28) {
            uVar12 = num_commands - 0x29;
          }
          plVar3 = (long *)((long)pvVar11 + uVar35 * 0xb10 + 0xb00);
          *plVar3 = *plVar3 + 0x28;
          for (lVar42 = 0; lVar42 != 0x28; lVar42 = lVar42 + 1) {
            piVar1 = (int *)((long)pvVar11 +
                            (ulong)*(ushort *)((long)pvVar7 + lVar42 * 2 + uVar12 * 2) * 4 +
                            uVar35 * 0xb10);
            *piVar1 = *piVar1 + 1;
          }
        }
        uVar12 = (num_commands * 2) / 0x28 + local_fd0 + 99;
        uVar36 = 7;
        for (uVar35 = 0; uVar35 < uVar12 - uVar12 % local_fd0; uVar35 = uVar35 + 1) {
          memset(local_b40,0,0xb08);
          uVar36 = (ulong)(uint)((int)uVar36 * 0x41a7);
          puVar13 = (ushort *)((long)pvVar7 + (uVar36 % (num_commands - 0x27)) * 2);
          for (lVar42 = -0x28; lVar42 != 0; lVar42 = lVar42 + 1) {
            uVar5 = *puVar13;
            puVar13 = puVar13 + 1;
            *(int *)(local_b40 + (ulong)uVar5 * 4) = *(int *)(local_b40 + (ulong)uVar5 * 4) + 1;
          }
          lVar42 = (uVar35 % local_fd0) * 0xb10;
          plVar3 = (long *)((long)pvVar11 + lVar42 + 0xb00);
          *plVar3 = *plVar3 + 0x28;
          for (lVar24 = 0; lVar24 != 0x2c0; lVar24 = lVar24 + 1) {
            piVar1 = (int *)((long)pvVar11 + lVar24 * 4 + lVar42);
            *piVar1 = *piVar1 + *(int *)(local_b40 + lVar24 * 4);
          }
        }
        pvVar14 = BrotliAllocate(m,num_commands);
        iVar26 = (int)local_fd0;
        pdVar15 = (double *)BrotliAllocate(m,local_fd0 * 0x1600);
        pvVar16 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 8));
        sVar6 = (iVar26 + 7U >> 3) * num_commands;
        if (sVar6 == 0) {
          local_f90 = (void *)0x0;
        }
        else {
          local_f90 = BrotliAllocate(m,sVar6);
        }
        pvVar17 = BrotliAllocate(m,(ulong)(uint)(iVar26 * 2));
        if (10 < params->quality) {
          local_f80 = (HistogramPair *)10;
        }
        local_1008 = 0;
        for (lVar42 = 0; (HistogramPair *)lVar42 != local_f80; lVar42 = lVar42 + 1) {
          if (local_fd0 < 2) {
            for (sVar6 = 0; local_1008 = 1, num_commands != sVar6; sVar6 = sVar6 + 1) {
              *(undefined1 *)((long)pvVar14 + sVar6) = 0;
            }
          }
          else {
            uVar36 = local_fd0 + 7 >> 3;
            memset(pdVar15,0,local_fd0 * 0x1600);
            puVar30 = (uint *)((long)pvVar11 + 0xb00);
            for (uVar35 = 0; local_fd0 != uVar35; uVar35 = uVar35 + 1) {
              uVar12 = (ulong)*puVar30;
              if (uVar12 < 0x100) {
                dVar48 = kLog2Table[uVar12];
              }
              else {
                dVar48 = log2((double)uVar12);
              }
              pdVar15[uVar35] = dVar48;
              puVar30 = puVar30 + 0x2c4;
            }
            lVar32 = local_fd0 * 0x15f8;
            lVar18 = 0x2c0;
            lVar24 = (long)pvVar11 + 0xafc;
            while (bVar47 = lVar18 != 0, lVar18 = lVar18 + -1, bVar47) {
              pdVar40 = pdVar15;
              for (lVar45 = 0; local_fd0 * 0x162 - lVar45 != 0; lVar45 = lVar45 + 0x162) {
                dVar48 = *pdVar15;
                uVar4 = *(uint *)(lVar24 + lVar45 * 8);
                uVar35 = (ulong)uVar4;
                dVar49 = -2.0;
                if (uVar35 != 0) {
                  if (uVar4 < 0x100) {
                    dVar49 = kLog2Table[uVar35];
                  }
                  else {
                    dVar49 = log2((double)uVar35);
                  }
                }
                *(double *)((long)pdVar15 + lVar32) = dVar48 - dVar49;
                pdVar15 = pdVar15 + 1;
              }
              lVar32 = lVar32 + local_fd0 * -8;
              lVar24 = lVar24 + -4;
              pdVar15 = pdVar40;
            }
            memset(pvVar16,0,local_fd0 * 8);
            memset(local_f90,0,uVar36 * num_commands);
            for (uVar35 = 0; uVar35 != num_commands; uVar35 = uVar35 + 1) {
              uVar5 = *(ushort *)((long)pvVar7 + uVar35 * 2);
              dVar48 = 1e+99;
              for (uVar12 = 0; local_fd0 != uVar12; uVar12 = uVar12 + 1) {
                dVar49 = pdVar15[uVar5 * local_fd0 + uVar12] +
                         *(double *)((long)pvVar16 + uVar12 * 8);
                *(double *)((long)pvVar16 + uVar12 * 8) = dVar49;
                if (dVar49 < dVar48) {
                  *(char *)((long)pvVar14 + uVar35) = (char)uVar12;
                  dVar48 = dVar49;
                }
              }
              dVar49 = 13.5;
              if (uVar35 < 2000) {
                dVar49 = (((double)(long)uVar35 * 0.07) / 2000.0 + 0.77) * 13.5;
              }
              for (uVar12 = 0; local_fd0 != uVar12; uVar12 = uVar12 + 1) {
                dVar50 = *(double *)((long)pvVar16 + uVar12 * 8) - dVar48;
                *(double *)((long)pvVar16 + uVar12 * 8) = dVar50;
                if (dVar49 <= dVar50) {
                  *(double *)((long)pvVar16 + uVar12 * 8) = dVar49;
                  pbVar27 = (byte *)((long)local_f90 + (uVar12 >> 3) + uVar35 * uVar36);
                  *pbVar27 = *pbVar27 | '\x01' << ((byte)uVar12 & 7);
                }
              }
            }
            bVar25 = *(byte *)((long)pvVar14 + (num_commands - 1));
            pvVar19 = (void *)((num_commands - 2) * uVar36 + (long)local_f90);
            local_1008 = 1;
            for (sVar6 = num_commands; sVar6 != 1; sVar6 = sVar6 - 1) {
              if ((*(byte *)((long)pvVar19 + (ulong)(bVar25 >> 3)) >> (bVar25 & 7) & 1) != 0) {
                bVar33 = *(byte *)((long)pvVar14 + (sVar6 - 2));
                local_1008 = local_1008 + (bVar25 != bVar33);
                bVar25 = bVar33;
              }
              *(byte *)((long)pvVar14 + (sVar6 - 2)) = bVar25;
              pvVar19 = (void *)((long)pvVar19 - uVar36);
            }
          }
          for (uVar36 = 0; local_fd0 != uVar36; uVar36 = uVar36 + 1) {
            *(undefined2 *)((long)pvVar17 + uVar36 * 2) = 0x100;
          }
          uVar5 = 0;
          for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
            if (*(short *)((long)pvVar17 + (ulong)*(byte *)((long)pvVar14 + sVar6) * 2) == 0x100) {
              *(ushort *)((long)pvVar17 + (ulong)*(byte *)((long)pvVar14 + sVar6) * 2) = uVar5;
              uVar5 = uVar5 + 1;
            }
          }
          for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
            *(undefined1 *)((long)pvVar14 + sVar6) =
                 *(undefined1 *)((long)pvVar17 + (ulong)*(byte *)((long)pvVar14 + sVar6) * 2);
          }
          local_fd0 = (ulong)uVar5;
          for (lVar24 = 0; local_fd0 * 0xb10 - lVar24 != 0; lVar24 = lVar24 + 0xb10) {
            memset((void *)((long)pvVar11 + lVar24),0,0xb08);
            *(undefined8 *)((long)pvVar11 + lVar24 + 0xb08) = 0x7ff0000000000000;
          }
          for (sVar6 = 0; num_commands != sVar6; sVar6 = sVar6 + 1) {
            lVar24 = (ulong)*(byte *)((long)pvVar14 + sVar6) * 0xb10;
            piVar1 = (int *)((long)pvVar11 +
                            (ulong)*(ushort *)((long)pvVar7 + sVar6 * 2) * 4 + lVar24);
            *piVar1 = *piVar1 + 1;
            plVar3 = (long *)((long)pvVar11 + lVar24 + 0xb00);
            *plVar3 = *plVar3 + 1;
          }
        }
        BrotliFree(m,pdVar15);
        BrotliFree(m,pvVar16);
        BrotliFree(m,local_f90);
        BrotliFree(m,pvVar17);
        BrotliFree(m,pvVar11);
        if (local_1008 == 0) {
          local_fe0 = (uint32_t *)0x0;
          pvVar11 = (void *)0x0;
        }
        else {
          local_fe0 = (uint32_t *)BrotliAllocate(m,local_1008 * 4);
          pvVar11 = BrotliAllocate(m,local_1008 * 4);
        }
        uVar36 = local_1008 * 0x10 + 0x3f0;
        local_f78 = uVar36 >> 6;
        if (uVar36 < 0x40) {
          local_1000 = (HistogramCommand *)0x0;
          local_fa8 = (uint32_t *)0x0;
        }
        else {
          local_1000 = (HistogramCommand *)BrotliAllocate(m,local_f78 * 0xb10);
          local_fa8 = (uint32_t *)BrotliAllocate(m,local_f78 * 4);
        }
        if (local_1008 == 0) {
          out_01 = (HistogramCommand *)0x0;
        }
        else {
          uVar36 = 0x40;
          if (local_1008 < 0x40) {
            uVar36 = local_1008;
          }
          out_01 = (HistogramCommand *)BrotliAllocate(m,uVar36 * 0xb10);
        }
        local_f80 = (HistogramPair *)BrotliAllocate(m,0xc018);
        memset(sizes,0,0x100);
        memset(new_clusters,0,0x100);
        memset(symbols,0,0x100);
        memset(remap,0,0x100);
        memset(pvVar11,0,local_1008 * 4);
        lVar42 = 0;
        sVar6 = 0;
        while (sVar38 = sVar6 + 1, sVar38 - num_commands != 1) {
          piVar1 = (int *)((long)pvVar11 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if ((sVar38 == num_commands) ||
             (pcVar2 = (char *)((long)pvVar14 + sVar6), sVar6 = sVar38,
             *pcVar2 != *(char *)((long)pvVar14 + sVar38))) {
            lVar42 = lVar42 + 1;
            sVar6 = sVar38;
          }
        }
        local_fc8 = 0.0;
        local_f88 = local_fe0;
        uVar12 = 0;
        uVar35 = 0;
        local_fa0 = (void *)0x0;
        local_f98 = 0;
        uVar36 = local_1008;
        local_f70 = local_f78;
        while( true ) {
          uVar21 = 0x40;
          if (uVar36 < 0x40) {
            uVar21 = uVar36;
          }
          uVar46 = local_1008 - uVar35;
          if (local_1008 < uVar35 || uVar46 == 0) break;
          for (uVar41 = 0; uVar41 != uVar21; uVar41 = uVar41 + 1) {
            pHVar22 = out_01 + uVar41;
            pHVar52 = out_01;
            memset(pHVar22,0,0xb08);
            out_01[uVar41].bit_cost_ = INFINITY;
            uVar31 = 0;
            while (uVar31 < *(uint *)((long)pvVar11 + (uVar35 + uVar41) * 4)) {
              pHVar22->data_[*(ushort *)((long)pvVar7 + uVar31 * 2 + (long)local_fc8 * 2)] =
                   pHVar22->data_[*(ushort *)((long)pvVar7 + uVar31 * 2 + (long)local_fc8 * 2)] + 1;
              uVar31 = uVar31 + 1;
              pHVar22->total_count_ = uVar31;
            }
            dVar48 = BrotliPopulationCostCommand(pHVar22);
            pHVar22->bit_cost_ = dVar48;
            new_clusters[uVar41] = (uint32_t)uVar41;
            symbols[uVar41] = (uint32_t)uVar41;
            sizes[uVar41] = 1;
            local_fc8 = (double)((long)local_fc8 + uVar31);
            out_01 = pHVar52;
          }
          if (0x3f < uVar46) {
            uVar46 = 0x40;
          }
          sVar6 = BrotliHistogramCombineCommand
                            (out_01,sizes,symbols,new_clusters,local_f80,uVar46,uVar46,0x40,0x800);
          uVar46 = local_f98 + sVar6;
          if (local_f78 < uVar46) {
            uVar41 = local_f78;
            if (local_f78 == 0) {
              uVar41 = uVar46;
            }
            do {
              uVar31 = uVar41;
              uVar41 = uVar31 * 2;
            } while (uVar31 < uVar46);
            pHVar22 = (HistogramCommand *)BrotliAllocate(m,uVar31 * 0xb10);
            if (local_f78 != 0) {
              memcpy(pHVar22,local_1000,local_f78 * 0xb10);
            }
            BrotliFree(m,local_1000);
            local_1000 = pHVar22;
            local_f78 = uVar31;
          }
          uVar46 = (long)local_fa0 + sVar6;
          if (local_f70 < uVar46) {
            uVar41 = local_f70;
            if (local_f70 == 0) {
              uVar41 = uVar46;
            }
            do {
              uVar31 = uVar41;
              uVar41 = uVar31 * 2;
            } while (uVar31 < uVar46);
            puVar10 = (uint32_t *)BrotliAllocate(m,uVar31 * 4);
            if (local_f70 != 0) {
              memcpy(puVar10,local_fa8,local_f70 << 2);
            }
            BrotliFree(m,local_fa8);
            local_f70 = uVar31;
            local_fa8 = puVar10;
          }
          pHVar22 = local_1000 + local_f98;
          for (sVar38 = 0; sVar6 != sVar38; sVar38 = sVar38 + 1) {
            uVar4 = new_clusters[sVar38];
            memcpy(pHVar22,out_01 + uVar4,0xb10);
            local_fa8[(long)local_fa0 + sVar38] = sizes[uVar4];
            remap[new_clusters[sVar38]] = (uint32_t)sVar38;
            pHVar22 = pHVar22 + 1;
          }
          local_fa0 = (void *)((long)local_fa0 + sVar38);
          local_f98 = local_f98 + sVar38;
          for (uVar46 = 0; uVar21 != uVar46; uVar46 = uVar46 + 1) {
            local_f88[uVar46] = remap[symbols[uVar46]] + (int)uVar12;
          }
          uVar12 = uVar12 + sVar6;
          uVar35 = uVar35 + 0x40;
          uVar36 = uVar36 - 0x40;
          local_f88 = local_f88 + 0x40;
        }
        BrotliFree(m,out_01);
        uVar36 = (uVar12 >> 1) * uVar12;
        if (uVar12 << 6 < uVar36) {
          uVar36 = uVar12 << 6;
        }
        if (0x800 < uVar36) {
          BrotliFree(m,local_f80);
          local_f80 = (HistogramPair *)BrotliAllocate(m,uVar36 * 0x18 + 0x18);
        }
        if (uVar12 == 0) {
          puVar10 = (uint32_t *)0x0;
        }
        else {
          puVar10 = (uint32_t *)BrotliAllocate(m,uVar12 * 4);
        }
        for (uVar35 = 0; uVar12 != uVar35; uVar35 = uVar35 + 1) {
          puVar10[uVar35] = (uint32_t)uVar35;
        }
        sVar6 = BrotliHistogramCombineCommand
                          (local_1000,local_fa8,local_fe0,puVar10,local_f80,uVar12,local_1008,0x100,
                           uVar36);
        BrotliFree(m,local_f80);
        BrotliFree(m,local_fa8);
        if (uVar12 == 0) {
          split = (BlockSplit *)0x0;
        }
        else {
          split = (BlockSplit *)BrotliAllocate(m,uVar12 * 4);
        }
        for (uVar36 = 0; uVar12 != uVar36; uVar36 = uVar36 + 1) {
          *(undefined4 *)((long)&split->num_types + uVar36 * 4) = 0xffffffff;
        }
        local_ff0 = (void *)0x0;
        iVar26 = 0;
        for (uVar36 = 0; uVar36 != local_1008; uVar36 = uVar36 + 1) {
          memset(local_b40,0,0xb08);
          local_38 = INFINITY;
          uVar35 = 0;
          while (uVar35 < *(uint *)((long)pvVar11 + uVar36 * 4)) {
            *(int *)(local_b40 +
                    (ulong)*(ushort *)((long)pvVar7 + uVar35 * 2 + (long)local_ff0 * 2) * 4) =
                 *(int *)(local_b40 +
                         (ulong)*(ushort *)((long)pvVar7 + uVar35 * 2 + (long)local_ff0 * 2) * 4) +
                 1;
            uVar35 = uVar35 + 1;
            local_40 = uVar35;
          }
          lVar42 = uVar36 - 1;
          if (uVar36 == 0) {
            lVar42 = 0;
          }
          uVar12 = (ulong)local_fe0[lVar42];
          local_fc8 = BrotliHistogramBitCostDistanceCommand
                                ((HistogramCommand *)local_b40,local_1000 + uVar12);
          local_ff0 = (void *)((long)local_ff0 + uVar35);
          for (sVar38 = 0; sVar6 != sVar38; sVar38 = sVar38 + 1) {
            dVar48 = BrotliHistogramBitCostDistanceCommand
                               ((HistogramCommand *)local_b40,local_1000 + puVar10[sVar38]);
            if (dVar48 < local_fc8) {
              uVar12 = (ulong)puVar10[sVar38];
              local_fc8 = dVar48;
            }
          }
          local_fe0[uVar36] = (uint32_t)uVar12;
          if (*(int *)((long)&split->num_types + uVar12 * 4) == -1) {
            *(int *)((long)&split->num_types + uVar12 * 4) = iVar26;
            iVar26 = iVar26 + 1;
          }
        }
        BrotliFree(m,puVar10);
        BrotliFree(m,local_1000);
        uVar36 = insert_and_copy_split->types_alloc_size;
        if (uVar36 < local_1008) {
          if (uVar36 == 0) {
            uVar36 = local_1008;
          }
          do {
            uVar35 = uVar36;
            uVar36 = uVar35 * 2;
          } while (uVar35 < local_1008);
          puVar9 = (uint8_t *)BrotliAllocate(m,uVar35);
          if (insert_and_copy_split->types_alloc_size != 0) {
            memcpy(puVar9,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
          }
          BrotliFree(m,insert_and_copy_split->types);
          insert_and_copy_split->types = puVar9;
          insert_and_copy_split->types_alloc_size = uVar35;
        }
        uVar36 = insert_and_copy_split->lengths_alloc_size;
        if (uVar36 < local_1008) {
          if (uVar36 == 0) {
            uVar36 = local_1008;
          }
          do {
            uVar35 = uVar36;
            uVar36 = uVar35 * 2;
          } while (uVar35 < local_1008);
          puVar10 = (uint32_t *)BrotliAllocate(m,uVar35 * 4);
          if (insert_and_copy_split->lengths_alloc_size != 0) {
            memcpy(puVar10,insert_and_copy_split->lengths,
                   insert_and_copy_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,insert_and_copy_split->lengths);
          insert_and_copy_split->lengths = puVar10;
          insert_and_copy_split->lengths_alloc_size = uVar35;
        }
        uVar35 = 0;
        sVar6 = 0;
        uVar36 = 0;
        do {
          uVar34 = 0;
          uVar12 = uVar35;
          do {
            uVar35 = uVar12 + 1;
            uVar21 = uVar36 & 0xff;
            if (uVar35 - local_1008 == 1) {
              insert_and_copy_split->num_blocks = sVar6;
              insert_and_copy_split->num_types = uVar21 + 1;
              BrotliFree(m,split);
              BrotliFree(m,pvVar11);
              BrotliFree(m,local_fe0);
              BrotliFree(m,pvVar14);
              goto LAB_00115149;
            }
            uVar34 = uVar34 + *(int *)((long)pvVar11 + uVar35 * 4 + -4);
            puVar30 = local_fe0 + uVar12;
          } while ((uVar35 != local_1008) && (uVar12 = uVar35, *puVar30 == local_fe0[uVar35]));
          uVar4 = *(uint *)((long)&split->num_types + (ulong)*puVar30 * 4);
          bVar25 = (byte)uVar4;
          insert_and_copy_split->types[sVar6] = bVar25;
          insert_and_copy_split->lengths[sVar6] = uVar34;
          bVar33 = (byte)uVar36;
          uVar36 = (ulong)uVar4;
          if (bVar25 < bVar33) {
            uVar36 = uVar21;
          }
          sVar6 = sVar6 + 1;
        } while( true );
      }
      sVar6 = insert_and_copy_split->num_blocks;
      uVar35 = insert_and_copy_split->types_alloc_size;
      uVar36 = sVar6 + 1;
      if (uVar35 < uVar36) {
        if (uVar35 == 0) {
          uVar35 = uVar36;
        }
        do {
          uVar12 = uVar35;
          uVar35 = uVar12 * 2;
        } while (uVar12 < uVar36);
        puVar9 = (uint8_t *)BrotliAllocate(m,uVar12);
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar9,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar9;
        insert_and_copy_split->types_alloc_size = uVar12;
        sVar6 = insert_and_copy_split->num_blocks;
        uVar36 = sVar6 + 1;
      }
      uVar35 = insert_and_copy_split->lengths_alloc_size;
      if (uVar35 < uVar36) {
        if (uVar35 == 0) {
          uVar35 = uVar36;
        }
        do {
          uVar12 = uVar35;
          uVar35 = uVar12 * 2;
        } while (uVar12 < uVar36);
        puVar10 = (uint32_t *)BrotliAllocate(m,uVar12 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar10,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar10;
        insert_and_copy_split->lengths_alloc_size = uVar12;
        sVar6 = insert_and_copy_split->num_blocks;
      }
      insert_and_copy_split->num_types = 1;
      insert_and_copy_split->types[sVar6] = '\0';
      sVar6 = insert_and_copy_split->num_blocks;
      insert_and_copy_split->lengths[sVar6] = (uint32_t)num_commands;
      insert_and_copy_split->num_blocks = sVar6 + 1;
    }
  }
  else {
    BrotliSplitBlockCommandsFromStored
              (m,cmds,num_commands,pos,sVar6,insert_and_copy_split,cmds_block_splits_decoder,
               current_block_cmds);
  }
LAB_00115149:
  BrotliFree(m,pvVar7);
  if (num_commands == 0) {
    puVar8 = (uint16_t *)0x0;
    dVar48 = extraout_XMM0_Qa;
  }
  else {
    puVar8 = (uint16_t *)BrotliAllocate(m,num_commands * 2);
    dVar48 = extraout_XMM0_Qa_00;
  }
  puVar43 = &cmds->dist_prefix_;
  sVar6 = 0;
  local_fc0 = num_commands;
  while (bVar47 = local_fc0 != 0, local_fc0 = local_fc0 - 1, bVar47) {
    if (((*(uint *)(puVar43 + -5) & 0x1ffffff) != 0) && (0x7f < puVar43[-1])) {
      puVar8[sVar6] = *puVar43 & 0x3ff;
      sVar6 = sVar6 + 1;
    }
    puVar43 = puVar43 + 8;
  }
  sVar38 = 1;
  if (literals_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    sVar38 = 0x32;
  }
  SplitByteVectorDistance
            (m,puVar8,sVar6,sVar38,(size_t)params,(size_t)dist_split,dVar48,
             in_stack_ffffffffffffefe8,split);
  BrotliFree(m,puVar8);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split,
                      const BlockSplitFromDecoder* literals_block_splits_decoder,
                      size_t* current_block_literals,
                      const BlockSplitFromDecoder* cmds_block_splits_decoder,
                      size_t* current_block_cmds) {

  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);

    /* Create the block split on the array of literals.
-       Literal histograms have alphabet size 256.
       If have block splits from decoder then use them. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorLiteral(
          m, literals, literals_count,
          kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
          kLiteralStrideLength, kLiteralBlockSwitchCost, params,
          literal_split);
    } else {
      BrotliSplitBlockLiteralsFromStored(m, cmds, num_commands, pos, mask,
                                         literal_split,
                                         literals_block_splits_decoder,
                                         current_block_literals);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }

    /* Create the block split on the array of command prefixes.
       If have block splits from decoder then use them. */
    if (cmds_block_splits_decoder == NULL) {
      SplitByteVectorCommand(
          m, insert_and_copy_codes, num_commands,
          kSymbolsPerCommandHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kCommandBlockSwitchCost, params,
          insert_and_copy_split);
    } else {
      BrotliSplitBlockCommandsFromStored(m, cmds, num_commands, pos, mask,
                                         insert_and_copy_split,
                                         cmds_block_splits_decoder,
                                         current_block_cmds);
    }
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    } else {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, 1,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}